

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

int ts_subtree_compare(Subtree left,Subtree right)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t n;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  
  if (((ulong)left.ptr & 1) == 0) {
    uVar2 = (left.ptr)->symbol;
  }
  else {
    uVar2 = (ushort)left.data.symbol;
  }
  iVar1 = -1;
  if (((ulong)right.ptr & 1) == 0) {
    uVar3 = (right.ptr)->symbol;
  }
  else {
    uVar3 = right._1_2_ & 0xff;
  }
  if (uVar3 <= uVar2) {
    if (((ulong)left.ptr & 1) == 0) {
      if (uVar3 < (left.ptr)->symbol) {
        return 1;
      }
      uVar5 = (left.ptr)->child_count;
    }
    else {
      uVar5 = 0;
      if (uVar3 < left.data.symbol) {
        return 1;
      }
    }
    uVar4 = 0;
    if ((((ulong)right.ptr & 1) != 0) || (uVar4 = (right.ptr)->child_count, uVar4 <= uVar5)) {
      if (((ulong)left.ptr & 1) == 0) {
        uVar6 = (ulong)(left.ptr)->child_count;
        if (uVar4 < (left.ptr)->child_count) {
          return 1;
        }
      }
      else {
        uVar6 = 0;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        iVar1 = ts_subtree_compare(((left.ptr)->field_17).field_0.children[uVar7],
                                   ((right.ptr)->field_17).field_0.children[uVar7]);
        if (iVar1 == -1) {
          return -1;
        }
        if (iVar1 == 1) {
          return 1;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ts_subtree_compare(Subtree left, Subtree right) {
  if (ts_subtree_symbol(left) < ts_subtree_symbol(right)) return -1;
  if (ts_subtree_symbol(right) < ts_subtree_symbol(left)) return 1;
  if (ts_subtree_child_count(left) < ts_subtree_child_count(right)) return -1;
  if (ts_subtree_child_count(right) < ts_subtree_child_count(left)) return 1;
  for (uint32_t i = 0, n = ts_subtree_child_count(left); i < n; i++) {
    Subtree left_child = left.ptr->children[i];
    Subtree right_child = right.ptr->children[i];
    switch (ts_subtree_compare(left_child, right_child)) {
      case -1: return -1;
      case 1: return 1;
      default: break;
    }
  }
  return 0;
}